

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O0

void prsvgf0(void *ctx0,toksdef *sym)

{
  uchar uVar1;
  ushort uVar2;
  long in_RSI;
  long in_RDI;
  emtcxdef *ec;
  prscxdef *ctx;
  ushort in_stack_ffffffffffffffde;
  emtcxdef *ctx_00;
  
  ctx_00 = *(emtcxdef **)(in_RDI + 0x28);
  emtres(ctx_00,in_stack_ffffffffffffffde);
  oswp2(ctx_00->emtcxptr + (int)(uint)ctx_00->emtcxofs,(uint)*(ushort *)(in_RSI + 2));
  ctx_00->emtcxofs = ctx_00->emtcxofs + 2;
  emtres(ctx_00,in_stack_ffffffffffffffde);
  uVar1 = *(uchar *)(in_RSI + 6);
  uVar2 = ctx_00->emtcxofs;
  ctx_00->emtcxofs = uVar2 + 1;
  ctx_00->emtcxptr[(int)(uint)uVar2] = uVar1;
  emtres(ctx_00,in_stack_ffffffffffffffde);
  memcpy(ctx_00->emtcxptr + (int)(uint)ctx_00->emtcxofs,(void *)(in_RSI + 7),
         (ulong)*(byte *)(in_RSI + 6));
  ctx_00->emtcxofs = ctx_00->emtcxofs + (ushort)*(byte *)(in_RSI + 6);
  return;
}

Assistant:

static void prsvgf0(void *ctx0, toksdef *sym)
{
    prscxdef *ctx = (prscxdef *)ctx0;
    emtcxdef *ec = ctx->prscxemt;

    /* write out value (offset from base ptr) and name of symbol */
    emtint2(ec, sym->toksval);
    emtbyte(ec, sym->tokslen);
    emtmem(ec, sym->toksnam, (size_t)sym->tokslen);
}